

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O2

Am_Value get_impl_parent_from_group_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar2;
  Am_Object group;
  Am_Object local_18;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&local_18,in_RSI);
  Am_Object::Get_Owner(&group,(Am_Slot_Flags)&local_18);
  Am_Object::~Am_Object(&local_18);
  bVar1 = Am_Object::Valid(&group);
  if (bVar1) {
    in_value = Am_Object::Get(&group,0xc5,1);
    Am_Value::operator=((Am_Value *)self,in_value);
  }
  else {
    Am_Value::operator=((Am_Value *)self,-1);
  }
  Am_Object::~Am_Object(&group);
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = self;
  return AVar2;
}

Assistant:

Am_Define_Formula(Am_Value, get_impl_parent_from_group)
{
  Am_Value value;
  //self is cmd, owner is scroll_bar, owner is scroll_group
  Am_Object group = self.Get_Owner().Get_Owner();
  if (group.Valid())
    value = group.Peek(Am_COMMAND);
  else
    value = Am_NOT_USUALLY_UNDONE;
  return value;
}